

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  undefined8 uVar7;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  U32 i;
  ZSTD_litLocation_e ZVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ulong **ppuVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  size_t sVar18;
  BYTE *pBVar19;
  size_t sVar20;
  ulong uVar21;
  uint uVar22;
  BYTE *oend;
  BYTE *pBVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  BYTE *oend_1;
  ulong uVar28;
  BYTE *pBVar29;
  ulong *puVar30;
  seqState_t seqState;
  seq_t sequences [8];
  size_t local_1f0;
  ulong local_1e8;
  BYTE *local_1e0;
  BYTE *local_1d8;
  BYTE *local_1d0;
  uint local_1c4;
  BYTE *local_1c0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  BYTE *local_1a8;
  uint local_19c;
  BIT_DStream_t local_198;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  ZSTD_fseState local_150;
  ulong *local_140 [3];
  BYTE *local_128 [3];
  ulong *local_110;
  BYTE *local_108;
  BYTE *local_100;
  ulong local_f8;
  size_t local_f0;
  ulong local_e8 [23];
  
  ZVar8 = dctx->litBufferLocation;
  if (ZVar8 == ZSTD_in_dst) {
    local_1d8 = dctx->litBuffer;
  }
  else {
    local_1d8 = (BYTE *)(maxDstSize + (long)dst);
  }
  local_1e0 = dctx->litPtr;
  pBVar14 = dctx->litBufferEnd;
  local_1c4 = nbSeq;
  local_128[2] = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_00225a52;
  pBVar19 = (BYTE *)dctx->prefixStart;
  local_1c0 = (BYTE *)dctx->virtualStart;
  local_1d0 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar9 = -0xc;
  do {
    *(ulong *)((long)local_128 + lVar9 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar9);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0);
  local_19c = 8;
  if (nbSeq < 8) {
    local_19c = nbSeq;
  }
  if (dst == (void *)0x0) {
    __assert_fail("dst != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x6c0,
                  "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                 );
  }
  if ((long)seqSize < 0) {
    __assert_fail("iend >= ip",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x6c1,
                  "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                 );
  }
  if (seqSize == 0) {
    return 0xffffffffffffffec;
  }
  local_198.limitPtr = (char *)((long)seqStart + 8);
  if (seqSize < 8) {
    local_198.bitContainer = (size_t)*seqStart;
    switch(seqSize) {
    case 7:
      local_198.bitContainer = local_198.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30
      ;
    case 6:
      local_198.bitContainer =
           local_198.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
    case 5:
      local_198.bitContainer =
           local_198.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
    case 4:
      local_198.bitContainer =
           local_198.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
    case 3:
      local_198.bitContainer =
           local_198.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
    case 2:
      local_198.bitContainer = (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_198.bitContainer
      ;
    }
    bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffec;
    }
    uVar22 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
    }
    local_198.bitsConsumed = (uVar22 ^ 0x1f) + (int)seqSize * -8 + 0x29;
    local_198.ptr = (char *)seqStart;
  }
  else {
    local_198.ptr = (char *)((long)seqStart + (seqSize - 8));
    local_198.bitContainer = *(size_t *)local_198.ptr;
    if (local_198.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffec;
    }
    uVar22 = 0x1f;
    bVar1 = (byte)(local_198.bitContainer >> 0x38);
    if (bVar1 != 0) {
      for (; bVar1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
    }
    local_198.bitsConsumed = ~uVar22 + 9;
  }
  local_1b8 = pBVar14;
  local_198.start = (char *)seqStart;
  ZSTD_initFseState(&local_170,&local_198,dctx->LLTptr);
  ZSTD_initFseState(&local_160,&local_198,dctx->OFTptr);
  ZSTD_initFseState(&local_150,&local_198,dctx->MLTptr);
  uVar25 = 0;
  if (local_198.bitsConsumed < 0x41) {
    uVar26 = 0;
    uVar25 = 0;
    if (0 < (int)local_19c) {
      uVar25 = (ulong)local_19c;
    }
    puVar24 = local_e8;
    do {
      if (local_198.ptr < local_198.limitPtr) {
        if (local_198.ptr != local_198.start) {
          uVar22 = (int)local_198.ptr - (int)local_198.start;
          if (local_198.start <=
              (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3))) {
            uVar22 = local_198.bitsConsumed >> 3;
          }
          local_198.bitsConsumed = local_198.bitsConsumed + uVar22 * -8;
          goto LAB_00225c2c;
        }
      }
      else {
        uVar22 = local_198.bitsConsumed >> 3;
        local_198.bitsConsumed = local_198.bitsConsumed & 7;
LAB_00225c2c:
        local_198.ptr = (char *)((long)local_198.ptr - (ulong)uVar22);
        local_198.bitContainer = *(size_t *)local_198.ptr;
      }
      if (uVar25 == uVar26) goto LAB_0022605f;
      bVar1 = local_170.table[local_170.state].nbAdditionalBits;
      if (0x10 < bVar1) goto LAB_00227b0b;
      bVar12 = local_150.table[local_150.state].nbAdditionalBits;
      if (0x10 < bVar12) goto LAB_00227b2a;
      local_110 = (ulong *)local_198.limitPtr;
      bVar2 = local_160.table[local_160.state].nbAdditionalBits;
      if (0x1f < bVar2) goto LAB_00227b49;
      uVar21 = (ulong)local_150.table[local_150.state].baseValue;
      uVar22 = local_170.table[local_170.state].baseValue;
      uVar28 = (ulong)uVar22;
      uVar5 = local_170.table[local_170.state].nextState;
      local_1b0 = (BYTE *)(ulong)local_150.table[local_150.state].nextState;
      local_128[1] = (BYTE *)(ulong)local_160.table[local_160.state].nextState;
      bVar3 = local_170.table[local_170.state].nbBits;
      bVar4 = local_150.table[local_150.state].nbBits;
      local_1a8 = (BYTE *)CONCAT44(local_1a8._4_4_,(uint)local_160.table[local_160.state].nbBits);
      bVar10 = (byte)local_198.bitsConsumed;
      if (bVar2 < 2) {
        if (bVar2 == 0) {
          puVar30 = local_140[uVar22 == 0];
          ppuVar13 = local_140 + (uVar22 != 0);
        }
        else {
          local_198.bitsConsumed = local_198.bitsConsumed + 1;
          lVar9 = (ulong)(local_160.table[local_160.state].baseValue + (uint)(uVar22 == 0)) -
                  ((long)(local_198.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
          if (lVar9 == 3) {
            puVar30 = (ulong *)((long)local_140[0] + ((ulong)(local_140[0] == (ulong *)0x1) - 1));
LAB_00226022:
            local_140[2] = local_140[1];
          }
          else {
            puVar30 = (ulong *)((long)local_140[lVar9] + (ulong)(local_140[lVar9] == (ulong *)0x0));
            if (lVar9 != 1) goto LAB_00226022;
          }
          ppuVar13 = local_140;
        }
      }
      else {
        local_198.bitsConsumed = local_198.bitsConsumed + bVar2;
        puVar30 = (ulong *)(((local_198.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                           (ulong)local_160.table[local_160.state].baseValue);
        local_140[2] = local_140[1];
        ppuVar13 = local_140;
      }
      local_140[1] = *ppuVar13;
      local_140[0] = puVar30;
      if (bVar12 != 0) {
        bVar10 = (byte)local_198.bitsConsumed;
        local_198.bitsConsumed = local_198.bitsConsumed + bVar12;
        uVar21 = uVar21 + ((local_198.bitContainer << (bVar10 & 0x3f)) >> (-bVar12 & 0x3f));
      }
      if ((0x1e < (byte)(bVar12 + bVar1 + bVar2)) && (local_198.bitsConsumed < 0x41)) {
        if (local_198.ptr < local_198.limitPtr) {
          if (local_198.ptr != local_198.start) {
            uVar22 = (int)local_198.ptr - (int)local_198.start;
            if (local_198.start <=
                (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3))) {
              uVar22 = local_198.bitsConsumed >> 3;
            }
            local_198.ptr = (char *)((long)local_198.ptr - (ulong)uVar22);
            local_198.bitsConsumed = local_198.bitsConsumed + uVar22 * -8;
            local_198.bitContainer = *(size_t *)local_198.ptr;
          }
        }
        else {
          BIT_reloadDStreamFast(&local_198);
        }
      }
      if (bVar1 != 0) {
        bVar12 = (byte)local_198.bitsConsumed;
        local_198.bitsConsumed = local_198.bitsConsumed + bVar1;
        uVar28 = uVar28 + ((local_198.bitContainer << (bVar12 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      if (0x1f < bVar3) goto LAB_00227aec;
      local_170.state =
           (~(-1L << (bVar3 & 0x3f)) &
           local_198.bitContainer >> (-(char)(bVar3 + local_198.bitsConsumed) & 0x3fU)) +
           (ulong)uVar5;
      if (0x1f < bVar4) goto LAB_00227aec;
      iVar27 = bVar3 + local_198.bitsConsumed + (uint)bVar4;
      local_150.state =
           (size_t)(local_1b0 +
                   (~(-1L << (bVar4 & 0x3f)) & local_198.bitContainer >> (-(char)iVar27 & 0x3fU)));
      if (0x1f < (byte)local_1a8) goto LAB_00227aec;
      local_198.bitsConsumed = iVar27 + (int)local_1a8;
      local_160.state =
           (size_t)(local_128[1] +
                   (~(-1L << ((byte)local_1a8 & 0x3f)) &
                   local_198.bitContainer >> (-(char)local_198.bitsConsumed & 0x3fU)));
      puVar24[-2] = uVar28;
      puVar24[-1] = uVar21;
      *puVar24 = (ulong)puVar30;
      uVar26 = uVar26 + 1;
      puVar24 = puVar24 + 3;
    } while (local_198.bitsConsumed < 0x41);
    uVar25 = uVar26 & 0xffffffff;
  }
  if ((int)uVar25 < (int)local_19c) {
    return 0xffffffffffffffec;
  }
LAB_0022605f:
  local_1a8 = local_1d8 + -0x20;
  local_128[0] = dctx->litExtraBuffer;
  local_100 = dctx->litExtraBuffer + 0x10000;
  local_108 = dctx->litExtraBuffer + 0x10;
  dst = local_128[2];
LAB_002260a5:
  puVar24 = local_140[1];
  uVar22 = (uint)uVar25;
  if (0x40 < local_198.bitsConsumed) goto LAB_00226fd3;
  if (local_198.ptr < local_198.limitPtr) {
    if (local_198.ptr != local_198.start) {
      uVar25 = (ulong)(uint)((int)local_198.ptr - (int)local_198.start);
      if (local_198.start <= (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3)))
      {
        uVar25 = (ulong)(local_198.bitsConsumed >> 3);
      }
      local_198.bitsConsumed = local_198.bitsConsumed + (int)uVar25 * -8;
      goto LAB_00226114;
    }
  }
  else {
    uVar25 = (ulong)(local_198.bitsConsumed >> 3);
    local_198.bitsConsumed = local_198.bitsConsumed & 7;
LAB_00226114:
    local_198.ptr = (char *)((long)local_198.ptr - uVar25);
    local_198.bitContainer = *(size_t *)local_198.ptr;
  }
  if ((int)local_1c4 <= (int)uVar22) goto LAB_00226fe9;
  bVar1 = local_170.table[local_170.state].nbAdditionalBits;
  if (0x10 < bVar1) {
LAB_00227b0b:
    __assert_fail("llBits <= MaxLLBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4c8,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar12 = local_150.table[local_150.state].nbAdditionalBits;
  if (0x10 < bVar12) {
LAB_00227b2a:
    __assert_fail("mlBits <= MaxMLBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4c9,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar2 = local_160.table[local_160.state].nbAdditionalBits;
  if (0x1f < bVar2) {
LAB_00227b49:
    __assert_fail("ofBits <= MaxOff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4ca,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  local_1f0 = (size_t)local_150.table[local_150.state].baseValue;
  uVar6 = local_170.table[local_170.state].baseValue;
  local_1e8 = (ulong)uVar6;
  uVar5 = local_170.table[local_170.state].nextState;
  local_1b0 = (BYTE *)(ulong)local_150.table[local_150.state].nextState;
  local_128[1] = (BYTE *)(ulong)local_160.table[local_160.state].nextState;
  bVar3 = local_170.table[local_170.state].nbBits;
  bVar4 = local_150.table[local_150.state].nbBits;
  bVar10 = local_160.table[local_160.state].nbBits;
  bVar11 = (byte)local_198.bitsConsumed;
  if (bVar2 < 2) {
    if (bVar2 == 0) {
      puVar30 = local_140[uVar6 == 0];
      local_140[0] = local_140[uVar6 != 0];
    }
    else {
      local_198.bitsConsumed = local_198.bitsConsumed + 1;
      lVar9 = (ulong)(local_160.table[local_160.state].baseValue + (uint)(uVar6 == 0)) -
              ((long)(local_198.bitContainer << (bVar11 & 0x3f)) >> 0x3f);
      if (lVar9 == 3) {
        puVar30 = (ulong *)((long)local_140[0] + ((ulong)(local_140[0] == (ulong *)0x1) - 1));
      }
      else {
        puVar30 = (ulong *)((long)local_140[lVar9] + (ulong)(local_140[lVar9] == (ulong *)0x0));
        if (lVar9 == 1) goto LAB_00226260;
      }
      local_140[2] = local_140[1];
    }
LAB_00226260:
    local_140[1] = local_140[0];
  }
  else {
    local_198.bitsConsumed = local_198.bitsConsumed + bVar2;
    puVar30 = (ulong *)(((local_198.bitContainer << (bVar11 & 0x3f)) >> (-bVar2 & 0x3f)) +
                       (ulong)local_160.table[local_160.state].baseValue);
    local_140[1] = local_140[0];
    local_140[2] = puVar24;
  }
  local_140[0] = puVar30;
  if (bVar12 != 0) {
    bVar11 = (byte)local_198.bitsConsumed;
    local_198.bitsConsumed = local_198.bitsConsumed + bVar12;
    local_1f0 = local_1f0 + ((local_198.bitContainer << (bVar11 & 0x3f)) >> (-bVar12 & 0x3f));
  }
  if ((0x1e < (byte)(bVar12 + bVar1 + bVar2)) && (local_198.bitsConsumed < 0x41)) {
    if (local_198.ptr < local_198.limitPtr) {
      if (local_198.ptr != local_198.start) {
        uVar6 = (int)local_198.ptr - (int)local_198.start;
        if (local_198.start <= (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3))
           ) {
          uVar6 = local_198.bitsConsumed >> 3;
        }
        local_198.ptr = (char *)((long)local_198.ptr - (ulong)uVar6);
        local_198.bitsConsumed = local_198.bitsConsumed + uVar6 * -8;
        local_198.bitContainer = *(size_t *)local_198.ptr;
      }
    }
    else {
      BIT_reloadDStreamFast(&local_198);
    }
  }
  if (bVar1 != 0) {
    bVar12 = (byte)local_198.bitsConsumed;
    local_198.bitsConsumed = local_198.bitsConsumed + bVar1;
    local_1e8 = local_1e8 + ((local_198.bitContainer << (bVar12 & 0x3f)) >> (-bVar1 & 0x3f));
  }
  if (0x1f < bVar3) {
LAB_00227aec:
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  local_170.state =
       (~(-1L << (bVar3 & 0x3f)) &
       local_198.bitContainer >> (-(char)(bVar3 + local_198.bitsConsumed) & 0x3fU)) + (ulong)uVar5;
  if (0x1f < bVar4) goto LAB_00227aec;
  iVar27 = bVar3 + local_198.bitsConsumed + (uint)bVar4;
  local_150.state =
       (size_t)(local_1b0 +
               (~(-1L << (bVar4 & 0x3f)) & local_198.bitContainer >> (-(char)iVar27 & 0x3fU)));
  if (0x1f < bVar10) goto LAB_00227aec;
  local_198.bitsConsumed = iVar27 + (uint)bVar10;
  local_160.state =
       (size_t)(local_128[1] +
               (~(-1L << (bVar10 & 0x3f)) &
               local_198.bitContainer >> (-(char)local_198.bitsConsumed & 0x3fU)));
  local_110 = puVar30;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar26 = (ulong)(uVar22 & 7);
    puVar24 = &local_f8 + uVar26 * 3;
    uVar25 = *puVar24;
    pBVar14 = local_1e0 + uVar25;
    if (dctx->litBufferEnd < pBVar14) {
      uVar28 = (long)dctx->litBufferEnd - (long)local_1e0;
      if (uVar28 != 0) {
        if ((ulong)((long)local_1d8 - (long)dst) < uVar28) {
          return 0xffffffffffffffba;
        }
        ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_1e0,uVar28);
        uVar25 = uVar25 - uVar28;
        *puVar24 = uVar25;
        dst = (void *)((long)dst + uVar28);
      }
      local_1e0 = local_128[0];
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00227b87;
      if ((long)uVar25 < 0x10001) {
        sVar18 = (&local_f0)[uVar26 * 3];
        sVar20 = sVar18 + uVar25;
        pBVar14 = (BYTE *)((long)dst + sVar20);
        if (local_1a8 < pBVar14) goto LAB_00226b9e;
        if ((long)uVar25 < 0) goto LAB_00227bc5;
        if ((long)sVar20 <= (long)uVar25) goto LAB_00227be4;
        if (local_1d8 < pBVar14) goto LAB_00227ba6;
        pBVar23 = (BYTE *)((long)dst + uVar25);
        if (local_1a8 < pBVar23) goto LAB_00227c03;
        uVar28 = local_e8[uVar26 * 3];
        uVar7 = *(undefined8 *)(local_128[0] + 8);
        *(undefined8 *)dst = *(undefined8 *)local_128[0];
        *(undefined8 *)((long)dst + 8) = uVar7;
        if (0x10 < uVar25) {
          if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_108))
          goto LAB_00227b68;
          uVar7 = *(undefined8 *)(local_108 + 8);
          *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_108;
          *(undefined8 *)((long)dst + 0x18) = uVar7;
          if (0x10 < uVar25 - 0x10) {
            lVar9 = 0;
            do {
              uVar7 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20 + 8);
              pBVar29 = (BYTE *)((long)dst + lVar9 + 0x20);
              *(undefined8 *)pBVar29 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20);
              *(undefined8 *)(pBVar29 + 8) = uVar7;
              uVar7 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30 + 8);
              *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30)
              ;
              *(undefined8 *)(pBVar29 + 0x18) = uVar7;
              lVar9 = lVar9 + 0x20;
            } while (pBVar29 + 0x20 < pBVar23);
          }
        }
        local_1e0 = local_128[0] + uVar25;
        pBVar29 = pBVar23 + -uVar28;
        if ((ulong)((long)pBVar23 - (long)pBVar19) < uVar28) {
          if ((ulong)((long)pBVar23 - (long)local_1c0) < uVar28) {
            return 0xffffffffffffffec;
          }
          lVar9 = (long)(pBVar23 + -uVar28) - (long)pBVar19;
          pBVar29 = local_1d0 + lVar9;
          if (local_1d0 < pBVar29 + sVar18) {
            local_1b0 = pBVar14;
            memmove(pBVar23,pBVar29,-lVar9);
            pBVar23 = pBVar23 + -lVar9;
            sVar18 = sVar18 + lVar9;
            pBVar14 = local_1b0;
            pBVar29 = pBVar19;
            goto LAB_00226537;
          }
          memmove(pBVar23,pBVar29,sVar18);
        }
        else {
LAB_00226537:
          if (pBVar14 < pBVar23) goto LAB_00227c41;
          if (pBVar29 < pBVar19) goto LAB_00227c22;
          if (sVar18 == 0) goto LAB_00227c60;
          if (uVar28 < 0x10) {
            if (pBVar23 < pBVar29) goto LAB_00227df3;
            if (uVar28 < 8) {
              iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar28 * 4);
              *pBVar23 = *pBVar29;
              pBVar23[1] = pBVar29[1];
              pBVar23[2] = pBVar29[2];
              pBVar23[3] = pBVar29[3];
              pBVar15 = pBVar29 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar28 * 4);
              pBVar29 = pBVar29 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar28 * 4) -
                                  (long)iVar27);
              *(undefined4 *)(pBVar23 + 4) = *(undefined4 *)pBVar15;
            }
            else {
              *(undefined8 *)pBVar23 = *(undefined8 *)pBVar29;
            }
            pBVar15 = pBVar29 + 8;
            pBVar17 = pBVar23 + 8;
            if ((long)pBVar17 - (long)pBVar15 < 8) goto LAB_00227dd4;
            if (8 < sVar18) {
              if (pBVar14 <= pBVar17) goto LAB_00227e12;
              if ((ulong)((long)pBVar17 - (long)pBVar15) < 0x10) {
                do {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                  pBVar17 = pBVar17 + 8;
                  pBVar15 = pBVar15 + 8;
                } while (pBVar17 < pBVar23 + sVar18);
              }
              else {
                uVar7 = *(undefined8 *)(pBVar29 + 0x10);
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                *(undefined8 *)(pBVar23 + 0x10) = uVar7;
                if (0x18 < (long)sVar18) {
                  lVar9 = 0;
                  do {
                    uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x18 + 8);
                    pBVar14 = pBVar23 + lVar9 + 0x18;
                    *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar29 + lVar9 + 0x18);
                    *(undefined8 *)(pBVar14 + 8) = uVar7;
                    uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x28 + 8);
                    *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar29 + lVar9 + 0x28);
                    *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                    lVar9 = lVar9 + 0x20;
                  } while (pBVar14 + 0x20 < pBVar23 + sVar18);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < pBVar23 + (-0x10 - (long)pBVar29)) goto LAB_00227b68;
            uVar7 = *(undefined8 *)(pBVar29 + 8);
            *(undefined8 *)pBVar23 = *(undefined8 *)pBVar29;
            *(undefined8 *)(pBVar23 + 8) = uVar7;
            if (0x10 < (long)sVar18) {
              lVar9 = 0x10;
              do {
                uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 8);
                pBVar14 = pBVar23 + lVar9;
                *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar29 + lVar9);
                *(undefined8 *)(pBVar14 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x10 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar29 + lVar9 + 0x10);
                *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                lVar9 = lVar9 + 0x20;
              } while (pBVar14 + 0x20 < pBVar23 + sVar18);
            }
          }
        }
      }
      else {
LAB_00226b9e:
        sequence_01.matchLength = (&local_f0)[uVar26 * 3];
        sequence_01.litLength = *puVar24;
        sequence_01.offset = local_e8[uVar26 * 3];
        sVar20 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,local_1d8,sequence_01,&local_1e0,local_100,pBVar19,local_1c0
                            ,local_1d0);
      }
      if (0xffffffffffffff88 < sVar20) {
        return sVar20;
      }
      *puVar24 = local_1e8;
      (&local_f0)[uVar26 * 3] = local_1f0;
      local_e8[uVar26 * 3] = (ulong)local_110;
      dst = (void *)((long)dst + sVar20);
      local_1b8 = local_100;
      goto LAB_00226a0a;
    }
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00227cdc;
    pBVar23 = pBVar14 + -0x20;
    if (local_1d8 <= pBVar23) goto LAB_00227cbd;
    if (local_1b8 < pBVar14) {
LAB_00226b2b:
      sequence_00.matchLength = (&local_f0)[uVar26 * 3];
      sequence_00.litLength = *puVar24;
      sequence_00.offset = local_e8[uVar26 * 3];
      pBVar29 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                  ((BYTE *)dst,local_1d8,pBVar23,sequence_00,&local_1e0,local_1b8,
                                   pBVar19,local_1c0,local_1d0);
      goto LAB_00226929;
    }
    sVar18 = (&local_f0)[uVar26 * 3];
    pBVar29 = (BYTE *)(sVar18 + uVar25);
    pBVar15 = (BYTE *)((long)dst + (long)pBVar29);
    if (pBVar23 < pBVar15) goto LAB_00226b2b;
    if ((long)uVar25 < 0) goto LAB_00227d58;
    if ((long)pBVar29 <= (long)uVar25) goto LAB_00227cfb;
    if (local_1d8 < pBVar15) goto LAB_00227d1a;
    pBVar17 = (BYTE *)((long)dst + uVar25);
    if (pBVar23 < pBVar17) goto LAB_00227d39;
    uVar26 = local_e8[uVar26 * 3];
    uVar7 = *(undefined8 *)(local_1e0 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_1e0;
    *(undefined8 *)((long)dst + 8) = uVar7;
    if (0x10 < uVar25) {
      ZSTD_decompressSequencesLong_cold_2();
    }
    pBVar23 = pBVar17 + -uVar26;
    local_1e0 = pBVar14;
    if ((ulong)((long)pBVar17 - (long)pBVar19) < uVar26) {
      if ((ulong)((long)pBVar17 - (long)local_1c0) < uVar26) {
        return 0xffffffffffffffec;
      }
      lVar9 = (long)pBVar23 - (long)pBVar19;
      pBVar14 = local_1d0 + lVar9;
      local_1b0 = pBVar29;
      if (pBVar14 + sVar18 <= local_1d0) {
        memmove(pBVar17,pBVar14,sVar18);
        pBVar29 = local_1b0;
        goto LAB_00226929;
      }
      local_128[1] = pBVar15;
      memmove(pBVar17,pBVar14,-lVar9);
      pBVar17 = pBVar17 + -lVar9;
      sVar18 = sVar18 + lVar9;
      pBVar23 = pBVar19;
      pBVar29 = local_1b0;
      pBVar15 = local_128[1];
    }
    if (pBVar15 < pBVar17) goto LAB_00227d96;
    if (pBVar23 < pBVar19) goto LAB_00227db5;
    if (sVar18 == 0) goto LAB_00227d77;
    if (uVar26 < 0x10) {
      if (pBVar17 < pBVar23) goto LAB_00227df3;
      if (uVar26 < 8) {
        iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar26 * 4);
        *pBVar17 = *pBVar23;
        pBVar17[1] = pBVar23[1];
        pBVar17[2] = pBVar23[2];
        pBVar17[3] = pBVar23[3];
        pBVar14 = pBVar23 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar26 * 4);
        pBVar23 = pBVar23 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar26 * 4) -
                            (long)iVar27);
        *(undefined4 *)(pBVar17 + 4) = *(undefined4 *)pBVar14;
      }
      else {
        *(undefined8 *)pBVar17 = *(undefined8 *)pBVar23;
      }
      pBVar14 = pBVar23 + 8;
      pBVar16 = pBVar17 + 8;
      if ((long)pBVar16 - (long)pBVar14 < 8) goto LAB_00227dd4;
      if (sVar18 < 9) goto LAB_00226929;
      if (pBVar15 <= pBVar16) goto LAB_00227e31;
      if ((ulong)((long)pBVar16 - (long)pBVar14) < 0x10) {
        do {
          *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
          pBVar16 = pBVar16 + 8;
          pBVar14 = pBVar14 + 8;
        } while (pBVar16 < pBVar17 + sVar18);
      }
      else {
        uVar7 = *(undefined8 *)(pBVar23 + 0x10);
        *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
        *(undefined8 *)(pBVar17 + 0x10) = uVar7;
        if (0x18 < (long)sVar18) {
          lVar9 = 0;
          do {
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x18 + 8);
            pBVar14 = pBVar17 + lVar9 + 0x18;
            *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar23 + lVar9 + 0x18);
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x28 + 8);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x28);
            *(undefined8 *)(pBVar14 + 0x18) = uVar7;
            lVar9 = lVar9 + 0x20;
          } while (pBVar14 + 0x20 < pBVar17 + sVar18);
        }
      }
    }
    else {
      if ((BYTE *)0xffffffffffffffe0 < pBVar17 + (-0x10 - (long)pBVar23)) goto LAB_00227b68;
      uVar7 = *(undefined8 *)(pBVar23 + 8);
      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar23;
      *(undefined8 *)(pBVar17 + 8) = uVar7;
      if (0x10 < (long)sVar18) {
        lVar9 = 0x10;
        do {
          uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 8);
          pBVar14 = pBVar17 + lVar9;
          *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar23 + lVar9);
          *(undefined8 *)(pBVar14 + 8) = uVar7;
          uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x10 + 8);
          *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x10);
          *(undefined8 *)(pBVar14 + 0x18) = uVar7;
          lVar9 = lVar9 + 0x20;
        } while (pBVar14 + 0x20 < pBVar17 + sVar18);
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00227b87;
    uVar26 = (ulong)(uVar22 & 7);
    uVar25 = (&local_f8)[uVar26 * 3];
    pBVar14 = local_1e0 + uVar25;
    if (pBVar14 <= local_1b8) {
      sVar18 = (&local_f0)[uVar26 * 3];
      pBVar29 = (BYTE *)(sVar18 + uVar25);
      pBVar23 = (BYTE *)((long)dst + (long)pBVar29);
      if (pBVar23 <= local_1a8) {
        if ((long)uVar25 < 0) goto LAB_00227bc5;
        if ((long)pBVar29 <= (long)uVar25) goto LAB_00227be4;
        if (local_1d8 < pBVar23) goto LAB_00227ba6;
        pBVar15 = (BYTE *)((long)dst + uVar25);
        if (local_1a8 < pBVar15) goto LAB_00227c03;
        uVar26 = local_e8[uVar26 * 3];
        uVar7 = *(undefined8 *)(local_1e0 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_1e0;
        *(undefined8 *)((long)dst + 8) = uVar7;
        if (0x10 < uVar25) {
          ZSTD_decompressSequencesLong_cold_1();
        }
        pBVar17 = pBVar15 + -uVar26;
        local_1e0 = pBVar14;
        if ((ulong)((long)pBVar15 - (long)pBVar19) < uVar26) {
          if ((ulong)((long)pBVar15 - (long)local_1c0) < uVar26) {
            return 0xffffffffffffffec;
          }
          lVar9 = (long)(pBVar15 + -uVar26) - (long)pBVar19;
          pBVar14 = local_1d0 + lVar9;
          local_1b0 = pBVar29;
          if (pBVar14 + sVar18 <= local_1d0) {
            memmove(pBVar15,pBVar14,sVar18);
            pBVar29 = local_1b0;
            goto LAB_00226929;
          }
          memmove(pBVar15,pBVar14,-lVar9);
          pBVar15 = pBVar15 + -lVar9;
          sVar18 = sVar18 + lVar9;
          pBVar17 = pBVar19;
          pBVar29 = local_1b0;
        }
        if (pBVar23 < pBVar15) goto LAB_00227c41;
        if (pBVar17 < pBVar19) goto LAB_00227c22;
        if (sVar18 == 0) goto LAB_00227c60;
        if (uVar26 < 0x10) {
          if (pBVar15 < pBVar17) goto LAB_00227df3;
          if (uVar26 < 8) {
            iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar26 * 4);
            *pBVar15 = *pBVar17;
            pBVar15[1] = pBVar17[1];
            pBVar15[2] = pBVar17[2];
            pBVar15[3] = pBVar17[3];
            pBVar14 = pBVar17 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar26 * 4);
            pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar26 * 4) -
                                (long)iVar27);
            *(undefined4 *)(pBVar15 + 4) = *(undefined4 *)pBVar14;
          }
          else {
            *(undefined8 *)pBVar15 = *(undefined8 *)pBVar17;
          }
          pBVar14 = pBVar17 + 8;
          pBVar16 = pBVar15 + 8;
          if ((long)pBVar16 - (long)pBVar14 < 8) goto LAB_00227dd4;
          if (8 < sVar18) {
            if (pBVar16 < pBVar23) {
              if ((ulong)((long)pBVar16 - (long)pBVar14) < 0x10) {
                do {
                  *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
                  pBVar16 = pBVar16 + 8;
                  pBVar14 = pBVar14 + 8;
                } while (pBVar16 < pBVar15 + sVar18);
              }
              else {
                uVar7 = *(undefined8 *)(pBVar17 + 0x10);
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
                *(undefined8 *)(pBVar15 + 0x10) = uVar7;
                if (0x18 < (long)sVar18) {
                  lVar9 = 0;
                  do {
                    uVar7 = *(undefined8 *)(pBVar17 + lVar9 + 0x18 + 8);
                    pBVar14 = pBVar15 + lVar9 + 0x18;
                    *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar17 + lVar9 + 0x18);
                    *(undefined8 *)(pBVar14 + 8) = uVar7;
                    uVar7 = *(undefined8 *)(pBVar17 + lVar9 + 0x28 + 8);
                    *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar17 + lVar9 + 0x28);
                    *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                    lVar9 = lVar9 + 0x20;
                  } while (pBVar14 + 0x20 < pBVar15 + sVar18);
                }
              }
              goto LAB_00226929;
            }
            goto LAB_00227e12;
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < pBVar15 + (-0x10 - (long)pBVar17)) goto LAB_00227b68;
          uVar7 = *(undefined8 *)(pBVar17 + 8);
          *(undefined8 *)pBVar15 = *(undefined8 *)pBVar17;
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          if (0x10 < (long)sVar18) {
            lVar9 = 0x10;
            do {
              uVar7 = *(undefined8 *)(pBVar17 + lVar9 + 8);
              pBVar14 = pBVar15 + lVar9;
              *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar17 + lVar9);
              *(undefined8 *)(pBVar14 + 8) = uVar7;
              uVar7 = *(undefined8 *)(pBVar17 + lVar9 + 0x10 + 8);
              *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar17 + lVar9 + 0x10);
              *(undefined8 *)(pBVar14 + 0x18) = uVar7;
              lVar9 = lVar9 + 0x20;
            } while (pBVar14 + 0x20 < pBVar15 + sVar18);
          }
        }
        goto LAB_00226929;
      }
    }
    sequence.matchLength = (&local_f0)[uVar26 * 3];
    sequence.litLength = (&local_f8)[uVar26 * 3];
    sequence.offset = local_e8[uVar26 * 3];
    pBVar29 = (BYTE *)ZSTD_execSequenceEnd
                                ((BYTE *)dst,local_1d8,sequence,&local_1e0,local_1b8,pBVar19,
                                 local_1c0,local_1d0);
  }
LAB_00226929:
  if ((BYTE *)0xffffffffffffff88 < pBVar29) {
    return (size_t)pBVar29;
  }
  uVar25 = (ulong)(uVar22 & 7);
  (&local_f8)[uVar25 * 3] = local_1e8;
  (&local_f0)[uVar25 * 3] = local_1f0;
  local_e8[uVar25 * 3] = (ulong)local_110;
  dst = (void *)((long)dst + (long)pBVar29);
LAB_00226a0a:
  uVar25 = (ulong)(uVar22 + 1);
  goto LAB_002260a5;
LAB_00226fd3:
  if ((int)uVar22 < (int)local_1c4) {
    return 0xffffffffffffffec;
  }
LAB_00226fe9:
  uVar22 = uVar22 - local_19c;
  if ((int)local_1c4 <= (int)uVar22) {
LAB_00227aab:
    lVar9 = 0;
    do {
      (dctx->entropy).rep[lVar9] = *(U32 *)(local_140 + lVar9);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    ZVar8 = dctx->litBufferLocation;
    pBVar14 = local_1b8;
LAB_00225a52:
    pBVar19 = local_1e0;
    if (ZVar8 == ZSTD_split) {
      sVar18 = (long)pBVar14 - (long)local_1e0;
      if ((ulong)((long)local_1d8 - (long)dst) < sVar18) {
        return 0xffffffffffffffba;
      }
      if ((BYTE *)dst == (BYTE *)0x0) {
        dst = (BYTE *)0x0;
      }
      else {
        memmove(dst,local_1e0,sVar18);
        dst = (void *)((long)dst + sVar18);
      }
      pBVar14 = dctx->litExtraBuffer + 0x10000;
      pBVar19 = dctx->litExtraBuffer;
    }
    sVar18 = (long)pBVar14 - (long)pBVar19;
    if (sVar18 <= (ulong)((long)local_1d8 - (long)dst)) {
      if ((BYTE *)dst == (BYTE *)0x0) {
        pBVar14 = (BYTE *)0x0;
      }
      else {
        memmove(dst,pBVar19,sVar18);
        pBVar14 = (BYTE *)((long)dst + sVar18);
      }
      return (size_t)(pBVar14 + -(long)local_128[2]);
    }
    return 0xffffffffffffffba;
  }
LAB_00227010:
  uVar25 = (ulong)(uVar22 & 7);
  puVar24 = &local_f8 + uVar25 * 3;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar26 = *puVar24;
    pBVar14 = local_1e0 + uVar26;
    if (dctx->litBufferEnd < pBVar14) {
      uVar28 = (long)dctx->litBufferEnd - (long)local_1e0;
      if (uVar28 != 0) {
        if ((ulong)((long)local_1d8 - (long)dst) < uVar28) {
          return 0xffffffffffffffba;
        }
        ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_1e0,uVar28);
        uVar26 = uVar26 - uVar28;
        *puVar24 = uVar26;
        dst = (void *)((long)dst + uVar28);
      }
      local_1e0 = local_128[0];
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00227b87;
      if ((long)uVar26 < 0x10001) {
        sVar18 = (&local_f0)[uVar25 * 3];
        sVar20 = sVar18 + uVar26;
        pBVar14 = (BYTE *)((long)dst + sVar20);
        if (local_1a8 < pBVar14) goto LAB_0022765e;
        if ((long)uVar26 < 0) goto LAB_00227bc5;
        if ((long)sVar20 <= (long)uVar26) goto LAB_00227be4;
        if (local_1d8 < pBVar14) goto LAB_00227ba6;
        pBVar23 = (BYTE *)((long)dst + uVar26);
        if (local_1a8 < pBVar23) goto LAB_00227c03;
        uVar25 = local_e8[uVar25 * 3];
        uVar7 = *(undefined8 *)(local_128[0] + 8);
        *(undefined8 *)dst = *(undefined8 *)local_128[0];
        *(undefined8 *)((long)dst + 8) = uVar7;
        if (0x10 < uVar26) {
          if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_108)) {
LAB_00227b68:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar7 = *(undefined8 *)(local_108 + 8);
          *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_108;
          *(undefined8 *)((long)dst + 0x18) = uVar7;
          if (0x10 < uVar26 - 0x10) {
            lVar9 = 0;
            do {
              uVar7 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20 + 8);
              pBVar29 = (BYTE *)((long)dst + lVar9 + 0x20);
              *(undefined8 *)pBVar29 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20);
              *(undefined8 *)(pBVar29 + 8) = uVar7;
              uVar7 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30 + 8);
              *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30)
              ;
              *(undefined8 *)(pBVar29 + 0x18) = uVar7;
              lVar9 = lVar9 + 0x20;
            } while (pBVar29 + 0x20 < pBVar23);
          }
        }
        local_1e0 = local_128[0] + uVar26;
        pBVar29 = pBVar23 + -uVar25;
        if ((ulong)((long)pBVar23 - (long)pBVar19) < uVar25) {
          if ((ulong)((long)pBVar23 - (long)local_1c0) < uVar25) {
            return 0xffffffffffffffec;
          }
          lVar9 = (long)(pBVar23 + -uVar25) - (long)pBVar19;
          pBVar29 = local_1d0 + lVar9;
          if (local_1d0 < pBVar29 + sVar18) {
            memmove(pBVar23,pBVar29,-lVar9);
            pBVar23 = pBVar23 + -lVar9;
            sVar18 = sVar18 + lVar9;
            pBVar29 = pBVar19;
            goto LAB_002271a6;
          }
          memmove(pBVar23,pBVar29,sVar18);
        }
        else {
LAB_002271a6:
          if (pBVar14 < pBVar23) goto LAB_00227c41;
          if (pBVar29 < pBVar19) goto LAB_00227c22;
          if (sVar18 == 0) goto LAB_00227c60;
          if (uVar25 < 0x10) {
            if (pBVar23 < pBVar29) goto LAB_00227df3;
            if (uVar25 < 8) {
              iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar25 * 4);
              *pBVar23 = *pBVar29;
              pBVar23[1] = pBVar29[1];
              pBVar23[2] = pBVar29[2];
              pBVar23[3] = pBVar29[3];
              pBVar15 = pBVar29 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4);
              pBVar29 = pBVar29 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4) -
                                  (long)iVar27);
              *(undefined4 *)(pBVar23 + 4) = *(undefined4 *)pBVar15;
            }
            else {
              *(undefined8 *)pBVar23 = *(undefined8 *)pBVar29;
            }
            pBVar15 = pBVar29 + 8;
            pBVar17 = pBVar23 + 8;
            if ((long)pBVar17 - (long)pBVar15 < 8) goto LAB_00227dd4;
            if (8 < sVar18) {
              if (pBVar14 <= pBVar17) goto LAB_00227e12;
              if ((ulong)((long)pBVar17 - (long)pBVar15) < 0x10) {
                do {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                  pBVar17 = pBVar17 + 8;
                  pBVar15 = pBVar15 + 8;
                } while (pBVar17 < pBVar23 + sVar18);
              }
              else {
                uVar7 = *(undefined8 *)(pBVar29 + 0x10);
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                *(undefined8 *)(pBVar23 + 0x10) = uVar7;
                if (0x18 < (long)sVar18) {
                  lVar9 = 0;
                  do {
                    uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x18 + 8);
                    pBVar14 = pBVar23 + lVar9 + 0x18;
                    *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar29 + lVar9 + 0x18);
                    *(undefined8 *)(pBVar14 + 8) = uVar7;
                    uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x28 + 8);
                    *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar29 + lVar9 + 0x28);
                    *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                    lVar9 = lVar9 + 0x20;
                  } while (pBVar14 + 0x20 < pBVar23 + sVar18);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < pBVar23 + (-0x10 - (long)pBVar29)) goto LAB_00227b68;
            uVar7 = *(undefined8 *)(pBVar29 + 8);
            *(undefined8 *)pBVar23 = *(undefined8 *)pBVar29;
            *(undefined8 *)(pBVar23 + 8) = uVar7;
            if (0x10 < (long)sVar18) {
              lVar9 = 0x10;
              do {
                uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 8);
                pBVar14 = pBVar23 + lVar9;
                *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar29 + lVar9);
                *(undefined8 *)(pBVar14 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar29 + lVar9 + 0x10 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar29 + lVar9 + 0x10);
                *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                lVar9 = lVar9 + 0x20;
              } while (pBVar14 + 0x20 < pBVar23 + sVar18);
            }
          }
        }
      }
      else {
LAB_0022765e:
        sequence_04.matchLength = (&local_f0)[uVar25 * 3];
        sequence_04.litLength = *puVar24;
        sequence_04.offset = local_e8[uVar25 * 3];
        sVar20 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,local_1d8,sequence_04,&local_1e0,
                            dctx->litExtraBuffer + 0x10000,pBVar19,local_1c0,local_1d0);
      }
      if (0xffffffffffffff88 < sVar20) {
        return sVar20;
      }
      dst = (void *)((long)dst + sVar20);
      local_1b8 = dctx->litExtraBuffer + 0x10000;
      goto LAB_0022758e;
    }
    if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00227cdc:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x431,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pBVar23 = pBVar14 + -0x20;
    if (local_1d8 <= pBVar23) {
LAB_00227cbd:
      __assert_fail("oend_w < oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x432,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (local_1b8 < pBVar14) {
LAB_002275e6:
      sequence_03.matchLength = (&local_f0)[uVar25 * 3];
      sequence_03.litLength = *puVar24;
      sequence_03.offset = local_e8[uVar25 * 3];
      uVar28 = ZSTD_execSequenceEndSplitLitBuffer
                         ((BYTE *)dst,local_1d8,pBVar23,sequence_03,&local_1e0,local_1b8,pBVar19,
                          local_1c0,local_1d0);
      goto LAB_00227509;
    }
    sVar18 = (&local_f0)[uVar25 * 3];
    uVar28 = sVar18 + uVar26;
    pBVar29 = (BYTE *)((long)dst + uVar28);
    if (pBVar23 < pBVar29) goto LAB_002275e6;
    if ((long)uVar26 < 0) {
LAB_00227d58:
      __assert_fail("op <= oLitEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x43f,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((long)uVar28 <= (long)uVar26) {
LAB_00227cfb:
      __assert_fail("oLitEnd < oMatchEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x440,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (local_1d8 < pBVar29) {
LAB_00227d1a:
      __assert_fail("oMatchEnd <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x441,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pBVar15 = (BYTE *)((long)dst + uVar26);
    if (pBVar23 < pBVar15) {
LAB_00227d39:
      __assert_fail("oLitEnd <= oend_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x443,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    uVar25 = local_e8[uVar25 * 3];
    uVar7 = *(undefined8 *)(local_1e0 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_1e0;
    *(undefined8 *)((long)dst + 8) = uVar7;
    if (0x10 < uVar26) {
      ZSTD_decompressSequencesLong_cold_4();
    }
    pBVar23 = pBVar15 + -uVar25;
    local_1e0 = pBVar14;
    if ((ulong)((long)pBVar15 - (long)pBVar19) < uVar25) {
      if ((ulong)((long)pBVar15 - (long)local_1c0) < uVar25) {
        return 0xffffffffffffffec;
      }
      lVar9 = (long)(pBVar15 + -uVar25) - (long)pBVar19;
      pBVar14 = local_1d0 + lVar9;
      if (pBVar14 + sVar18 <= local_1d0) {
        memmove(pBVar15,pBVar14,sVar18);
        goto LAB_00227509;
      }
      memmove(pBVar15,pBVar14,-lVar9);
      pBVar15 = pBVar15 + -lVar9;
      sVar18 = sVar18 + lVar9;
      pBVar23 = pBVar19;
    }
    if (pBVar29 < pBVar15) {
LAB_00227d96:
      __assert_fail("op <= oMatchEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x463,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (pBVar23 < pBVar19) {
LAB_00227db5:
      __assert_fail("match >= prefixStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x465,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (sVar18 == 0) {
LAB_00227d77:
      __assert_fail("sequence.matchLength >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x466,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (0xf < uVar25) {
      if (pBVar15 + (-0x10 - (long)pBVar23) < (BYTE *)0xffffffffffffffe1) {
        uVar7 = *(undefined8 *)(pBVar23 + 8);
        *(undefined8 *)pBVar15 = *(undefined8 *)pBVar23;
        *(undefined8 *)(pBVar15 + 8) = uVar7;
        if (0x10 < (long)sVar18) {
          lVar9 = 0x10;
          do {
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 8);
            pBVar14 = pBVar15 + lVar9;
            *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar23 + lVar9);
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x10 + 8);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x10);
            *(undefined8 *)(pBVar14 + 0x18) = uVar7;
            lVar9 = lVar9 + 0x20;
          } while (pBVar14 + 0x20 < pBVar15 + sVar18);
        }
        goto LAB_00227509;
      }
      goto LAB_00227b68;
    }
    if (pBVar15 < pBVar23) goto LAB_00227df3;
    if (uVar25 < 8) {
      iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar25 * 4);
      *pBVar15 = *pBVar23;
      pBVar15[1] = pBVar23[1];
      pBVar15[2] = pBVar23[2];
      pBVar15[3] = pBVar23[3];
      pBVar14 = pBVar23 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4);
      pBVar23 = pBVar23 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4) -
                          (long)iVar27);
      *(undefined4 *)(pBVar15 + 4) = *(undefined4 *)pBVar14;
    }
    else {
      *(undefined8 *)pBVar15 = *(undefined8 *)pBVar23;
    }
    pBVar14 = pBVar23 + 8;
    pBVar17 = pBVar15 + 8;
    if ((long)pBVar17 - (long)pBVar14 < 8) goto LAB_00227dd4;
    if (8 < sVar18) {
      if (pBVar29 <= pBVar17) {
LAB_00227e31:
        __assert_fail("op < oMatchEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x47a,
                      "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if ((ulong)((long)pBVar17 - (long)pBVar14) < 0x10) {
        do {
          *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
          pBVar17 = pBVar17 + 8;
          pBVar14 = pBVar14 + 8;
        } while (pBVar17 < pBVar15 + sVar18);
      }
      else {
        uVar7 = *(undefined8 *)(pBVar23 + 0x10);
        *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
        *(undefined8 *)(pBVar15 + 0x10) = uVar7;
        if (0x18 < (long)sVar18) {
          lVar9 = 0;
          do {
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x18 + 8);
            pBVar14 = pBVar15 + lVar9 + 0x18;
            *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar23 + lVar9 + 0x18);
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar23 + lVar9 + 0x28 + 8);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x28);
            *(undefined8 *)(pBVar14 + 0x18) = uVar7;
            lVar9 = lVar9 + 0x20;
          } while (pBVar14 + 0x20 < pBVar15 + sVar18);
        }
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00227b87:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x3d0,
                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    uVar26 = *puVar24;
    pBVar14 = local_1e0 + uVar26;
    if (pBVar14 <= local_1b8) {
      sVar18 = (&local_f0)[uVar25 * 3];
      uVar28 = sVar18 + uVar26;
      pBVar23 = (BYTE *)((long)dst + uVar28);
      if (pBVar23 <= local_1a8) {
        if ((long)uVar26 < 0) {
LAB_00227bc5:
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e3,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)uVar28 <= (long)uVar26) {
LAB_00227be4:
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e4,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (local_1d8 < pBVar23) {
LAB_00227ba6:
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e5,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        pBVar29 = (BYTE *)((long)dst + uVar26);
        if (local_1a8 < pBVar29) {
LAB_00227c03:
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,999,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar25 = local_e8[uVar25 * 3];
        uVar7 = *(undefined8 *)(local_1e0 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_1e0;
        *(undefined8 *)((long)dst + 8) = uVar7;
        if (0x10 < uVar26) {
          ZSTD_decompressSequencesLong_cold_3();
        }
        pBVar15 = pBVar29 + -uVar25;
        local_1e0 = pBVar14;
        if ((ulong)((long)pBVar29 - (long)pBVar19) < uVar25) {
          if ((ulong)((long)pBVar29 - (long)local_1c0) < uVar25) {
            return 0xffffffffffffffec;
          }
          lVar9 = (long)(pBVar29 + -uVar25) - (long)pBVar19;
          pBVar14 = local_1d0 + lVar9;
          if (pBVar14 + sVar18 <= local_1d0) {
            memmove(pBVar29,pBVar14,sVar18);
            goto LAB_00227509;
          }
          memmove(pBVar29,pBVar14,-lVar9);
          pBVar29 = pBVar29 + -lVar9;
          sVar18 = sVar18 + lVar9;
          pBVar15 = pBVar19;
        }
        if (pBVar23 < pBVar29) {
LAB_00227c41:
          __assert_fail("op <= oMatchEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x408,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (pBVar15 < pBVar19) {
LAB_00227c22:
          __assert_fail("match >= prefixStart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x40a,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (sVar18 == 0) {
LAB_00227c60:
          __assert_fail("sequence.matchLength >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x40b,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (uVar25 < 0x10) {
          if (pBVar29 < pBVar15) {
LAB_00227df3:
            __assert_fail("*ip <= *op",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
          }
          if (uVar25 < 8) {
            iVar27 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar25 * 4);
            *pBVar29 = *pBVar15;
            pBVar29[1] = pBVar15[1];
            pBVar29[2] = pBVar15[2];
            pBVar29[3] = pBVar15[3];
            pBVar14 = pBVar15 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4);
            pBVar15 = pBVar15 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4) -
                                (long)iVar27);
            *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar14;
          }
          else {
            *(undefined8 *)pBVar29 = *(undefined8 *)pBVar15;
          }
          pBVar14 = pBVar15 + 8;
          pBVar17 = pBVar29 + 8;
          if ((long)pBVar17 - (long)pBVar14 < 8) {
LAB_00227dd4:
            __assert_fail("*op - *ip >= 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
          }
          if (sVar18 < 9) goto LAB_00227509;
          if (pBVar23 <= pBVar17) {
LAB_00227e12:
            __assert_fail("op < oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x41f,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if ((ulong)((long)pBVar17 - (long)pBVar14) < 0x10) {
            do {
              *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
              pBVar17 = pBVar17 + 8;
              pBVar14 = pBVar14 + 8;
            } while (pBVar17 < pBVar29 + sVar18);
          }
          else {
            uVar7 = *(undefined8 *)(pBVar15 + 0x10);
            *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
            *(undefined8 *)(pBVar29 + 0x10) = uVar7;
            if (0x18 < (long)sVar18) {
              lVar9 = 0;
              do {
                uVar7 = *(undefined8 *)(pBVar15 + lVar9 + 0x18 + 8);
                pBVar14 = pBVar29 + lVar9 + 0x18;
                *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar15 + lVar9 + 0x18);
                *(undefined8 *)(pBVar14 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar15 + lVar9 + 0x28 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar15 + lVar9 + 0x28);
                *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                lVar9 = lVar9 + 0x20;
              } while (pBVar14 + 0x20 < pBVar29 + sVar18);
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < pBVar29 + (-0x10 - (long)pBVar15)) goto LAB_00227b68;
          uVar7 = *(undefined8 *)(pBVar15 + 8);
          *(undefined8 *)pBVar29 = *(undefined8 *)pBVar15;
          *(undefined8 *)(pBVar29 + 8) = uVar7;
          if (0x10 < (long)sVar18) {
            lVar9 = 0x10;
            do {
              uVar7 = *(undefined8 *)(pBVar15 + lVar9 + 8);
              pBVar14 = pBVar29 + lVar9;
              *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar15 + lVar9);
              *(undefined8 *)(pBVar14 + 8) = uVar7;
              uVar7 = *(undefined8 *)(pBVar15 + lVar9 + 0x10 + 8);
              *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar15 + lVar9 + 0x10);
              *(undefined8 *)(pBVar14 + 0x18) = uVar7;
              lVar9 = lVar9 + 0x20;
            } while (pBVar14 + 0x20 < pBVar29 + sVar18);
          }
        }
        goto LAB_00227509;
      }
    }
    sequence_02.matchLength = (&local_f0)[uVar25 * 3];
    sequence_02.litLength = *puVar24;
    sequence_02.offset = local_e8[uVar25 * 3];
    uVar28 = ZSTD_execSequenceEnd
                       ((BYTE *)dst,local_1d8,sequence_02,&local_1e0,local_1b8,pBVar19,local_1c0,
                        local_1d0);
  }
LAB_00227509:
  if (0xffffffffffffff88 < uVar28) {
    return uVar28;
  }
  dst = (void *)((long)dst + uVar28);
LAB_0022758e:
  uVar22 = uVar22 + 1;
  if (uVar22 == local_1c4) goto LAB_00227aab;
  goto LAB_00227010;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset,
                             const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}